

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O3

void wasm_val_vec_delete(wasm_val_vec_t *vec)

{
  long lVar1;
  ulong uVar2;
  
  fprintf(_stderr,"CAPI: [%s] \n","wasm_val_vec_delete");
  if (vec->size != 0) {
    lVar1 = 0;
    uVar2 = 0;
    do {
      wasm_val_delete((wasm_val_t *)(&vec->data->kind + lVar1));
      uVar2 = uVar2 + 1;
      lVar1 = lVar1 + 0x10;
    } while (uVar2 < vec->size);
  }
  if (vec->data != (wasm_val_t *)0x0) {
    operator_delete__(vec->data);
  }
  vec->size = 0;
  return;
}

Assistant:

void wasm_val_vec_delete(own wasm_val_vec_t* vec) {
  TRACE0();
  for (size_t i = 0; i < vec->size; ++i) {
    wasm_val_delete(&vec->data[i]);
  }
  delete[] vec->data;
  vec->size = 0;
}